

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlattribute.cpp
# Opt level: O1

string * __thiscall
libcellml::XmlAttribute::namespaceUri_abi_cxx11_(string *__return_storage_ptr__,XmlAttribute *this)

{
  xmlNs *pxVar1;
  allocator<char> local_9;
  
  pxVar1 = this->mPimpl->mXmlAttributePtr->ns;
  if (pxVar1 == (xmlNs *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)pxVar1->href,&local_9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string XmlAttribute::namespaceUri() const
{
    if (mPimpl->mXmlAttributePtr->ns == nullptr) {
        return {};
    }
    return reinterpret_cast<const char *>(mPimpl->mXmlAttributePtr->ns->href);
}